

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O0

void TCLAP::ExtractValue<int>(int *destVal,string *strVal,ValueLike *vl)

{
  byte bVar1;
  int iVar2;
  ArgParseException *pAVar3;
  allocator local_281;
  string local_280 [32];
  char local_260 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240 [38];
  undefined1 local_21a;
  allocator local_219;
  string local_218 [32];
  char local_1f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8 [52];
  int local_1a4;
  istringstream aiStack_1a0 [4];
  int valuesRead;
  istringstream is;
  ValueLike *vl_local;
  string *strVal_local;
  int *destVal_local;
  
  std::__cxx11::istringstream::istringstream(aiStack_1a0,strVal,8);
  local_1a4 = 0;
  while ((bVar1 = std::ios::good(), (bVar1 & 1) != 0 && (iVar2 = std::istream::peek(), iVar2 != -1))
        ) {
    std::istream::operator>>((istream *)aiStack_1a0,destVal);
    local_1a4 = local_1a4 + 1;
  }
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    if (local_1a4 < 2) {
      std::__cxx11::istringstream::~istringstream(aiStack_1a0);
      return;
    }
    pAVar3 = (ArgParseException *)__cxa_allocate_exception(0x68);
    std::operator+(local_260,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "More than one valid value parsed from string \'");
    std::operator+(local_240,local_260);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_280,"undefined",&local_281);
    ArgParseException::ArgParseException(pAVar3,local_240,(string *)local_280);
    __cxa_throw(pAVar3,&ArgParseException::typeinfo,ArgParseException::~ArgParseException);
  }
  local_21a = 1;
  pAVar3 = (ArgParseException *)__cxa_allocate_exception(0x68);
  std::operator+(local_1f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "Couldn\'t read argument value from string \'");
  std::operator+(local_1d8,local_1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"undefined",&local_219);
  ArgParseException::ArgParseException(pAVar3,local_1d8,(string *)local_218);
  local_21a = 0;
  __cxa_throw(pAVar3,&ArgParseException::typeinfo,ArgParseException::~ArgParseException);
}

Assistant:

void
ExtractValue(T &destVal, const std::string& strVal, ValueLike vl)
{
    static_cast<void>(vl); // Avoid warning about unused vl
    std::istringstream is(strVal);

    int valuesRead = 0;
    while ( is.good() ) {
	if ( is.peek() != EOF )
#ifdef TCLAP_SETBASE_ZERO
	    is >> std::setbase(0) >> destVal;
#else
	    is >> destVal;
#endif
	else
	    break;

	valuesRead++;
    }

    if ( is.fail() )
	throw( ArgParseException("Couldn't read argument value "
				 "from string '" + strVal + "'"));


    if ( valuesRead > 1 )
	throw( ArgParseException("More than one valid value parsed from "
				 "string '" + strVal + "'"));

}